

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.cpp
# Opt level: O3

int __thiscall zmq::dist_t::send_to_matching(dist_t *this,msg_t *msg_)

{
  byte bVar1;
  
  bVar1 = msg_t::flags(msg_);
  distribute(this,msg_);
  if ((bool)(bVar1 & 1) == false) {
    this->_active = this->_eligible;
  }
  this->_more = (bool)(bVar1 & 1);
  return 0;
}

Assistant:

int zmq::dist_t::send_to_matching (msg_t *msg_)
{
    //  Is this end of a multipart message?
    const bool msg_more = (msg_->flags () & msg_t::more) != 0;

    //  Push the message to matching pipes.
    distribute (msg_);

    //  If multipart message is fully sent, activate all the eligible pipes.
    if (!msg_more)
        _active = _eligible;

    _more = msg_more;

    return 0;
}